

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

int climateToBiome(int mc,uint64_t *np,uint64_t *dat)

{
  uint uVar1;
  long *in_RDX;
  uint64_t in_RSI;
  int in_EDI;
  uint64_t ds;
  int alt;
  int idx;
  BiomeTree *bt;
  uint32_t i;
  uint64_t d;
  uint64_t b;
  uint64_t a;
  uint64_t node;
  uint64_t ds_1;
  uint64_t *local_80;
  uint64_t *local_78;
  int local_64;
  BiomeTree *local_60;
  int depth;
  int in_stack_ffffffffffffffbc;
  uint idx_00;
  BiomeTree *in_stack_ffffffffffffffc0;
  uint64_t *in_stack_ffffffffffffffc8;
  
  if (in_EDI < 0x1c) {
    if (in_EDI < 0x19) {
      if (in_EDI < 0x18) {
        if (in_EDI < 0x17) {
          local_60 = &climateToBiome::btree18;
        }
        else {
          local_60 = &climateToBiome::btree192;
        }
      }
      else {
        local_60 = &climateToBiome::btree19;
      }
    }
    else {
      local_60 = &climateToBiome::btree20;
    }
  }
  else {
    local_60 = &climateToBiome::btree21wd;
  }
  depth = (int)((ulong)in_RDX >> 0x20);
  if (in_RDX == (long *)0x0) {
    local_64 = get_resulting_node(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                                  in_stack_ffffffffffffffbc,in_EDI,in_RSI,depth);
  }
  else {
    for (idx_00 = 0; idx_00 < 6; idx_00 = idx_00 + 1) {
      uVar1 = (uint)(local_60->nodes[(int)*in_RDX] >> ((byte)(idx_00 << 3) & 0x3f)) & 0xff;
      local_78 = (uint64_t *)
                 (*(long *)(in_RSI + (ulong)idx_00 * 8) -
                 (long)local_60->param[(int)(uVar1 * 2 + 1)]);
      in_stack_ffffffffffffffc8 =
           (uint64_t *)
           ((long)local_60->param[(int)(uVar1 << 1)] - *(long *)(in_RSI + (ulong)idx_00 * 8));
      if ((long)local_78 < 1) {
        local_80 = in_stack_ffffffffffffffc8;
        if ((long)in_stack_ffffffffffffffc8 < 1) {
          local_80 = (uint64_t *)0x0;
        }
        local_78 = local_80;
      }
      in_stack_ffffffffffffffc0 = (BiomeTree *)((long)local_78 * (long)local_78);
    }
    local_64 = get_resulting_node(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,idx_00,in_EDI,
                                  in_RSI,depth);
    *in_RDX = (long)local_64;
  }
  return (ushort)(local_60->nodes[local_64] >> 0x30) & 0xff;
}

Assistant:

int climateToBiome(int mc, const uint64_t np[6], uint64_t *dat)
{
    static const BiomeTree btree18 = {
        btree18_steps, &btree18_param[0][0], btree18_nodes, btree18_order,
        sizeof(btree18_nodes) / sizeof(uint64_t)
    };
    static const BiomeTree btree192 = {
        btree192_steps, &btree192_param[0][0], btree192_nodes, btree192_order,
        sizeof(btree192_nodes) / sizeof(uint64_t)
    };
    static const BiomeTree btree19 = {
        btree19_steps, &btree19_param[0][0], btree19_nodes, btree19_order,
        sizeof(btree19_nodes) / sizeof(uint64_t)
    };
    static const BiomeTree btree20 = {
        btree20_steps, &btree20_param[0][0], btree20_nodes, btree20_order,
        sizeof(btree20_nodes) / sizeof(uint64_t)
    };
    static const BiomeTree btree21wd = {
        btree21wd_steps, &btree21wd_param[0][0], btree21wd_nodes, btree21wd_order,
        sizeof(btree21wd_nodes) / sizeof(uint64_t)
    };

    const BiomeTree *bt;
    int idx;

    if (mc >= MC_1_21_WD)
        bt = &btree21wd;
    else if (mc >= MC_1_20_6)
        bt = &btree20;
    else if (mc >= MC_1_19_4)
        bt = &btree19;
    else if (mc >= MC_1_19_2)
        bt = &btree192;
    else
        bt = &btree18;

    if (dat)
    {
        int alt = (int) *dat;
        uint64_t ds = get_np_dist(np, bt, alt);
        idx = get_resulting_node(np, bt, 0, alt, ds, 0);
        *dat = (uint64_t) idx;
    }
    else
    {
        idx = get_resulting_node(np, bt, 0, 0, -1, 0);
    }

    return (bt->nodes[idx] >> 48) & 0xFF;
}